

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.cpp
# Opt level: O0

int main(void)

{
  size_t sVar1;
  ostream *poVar2;
  int local_14 [2];
  int ages [3];
  
  local_14[0] = 0xf;
  local_14[1] = 0x1e;
  ages[0] = 0x3c;
  sVar1 = std::size<int,3ul>((int (*) [3])local_14);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1);
  std::operator<<(poVar2,'\n');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
  std::operator<<(poVar2,'\n');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc);
  std::operator<<(poVar2,'\n');
  decay(local_14);
  return 0;
}

Assistant:

int main() {
  int ages[] = { 15, 30, 60 };
  // Number of elements = 3
  std::cout << std::size(ages) << '\n';
  // Size of an element = 4
  std::cout << sizeof(ages[0]) << '\n';
  // Size of array = 12 (= 3 * 4)
  std::cout << sizeof(ages) << '\n';
  decay(ages);
}